

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint ON_SubDMeshFragmentGrid::SetQuads
               (uint side_segment_count,uint level_of_detail,uint *quads,size_t quad_capacity,
               size_t quad_stride,uint *sides,size_t side_capacity,size_t side_stride)

{
  uint *puVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  if (side_segment_count - 1 < 0x40) {
    uVar2 = 1;
    do {
      uVar6 = uVar2;
      uVar2 = uVar6 * 2;
    } while (uVar6 < side_segment_count);
    if (uVar6 <= side_segment_count) {
      uVar2 = 0;
      if ((level_of_detail != 0 && 1 < side_segment_count) &&
         (uVar2 = level_of_detail,
         side_segment_count >> ((byte)level_of_detail & 0x1f) == 0 || 0x1f < level_of_detail)) {
        uVar6 = 1;
        do {
          uVar2 = uVar6;
          uVar6 = uVar2 * 2;
        } while (uVar2 * 2 < side_segment_count);
      }
      bVar3 = (byte)uVar2;
      iVar7 = 1 << (bVar3 & 0x1f);
      iVar5 = side_segment_count + 1 << (bVar3 & 0x1f);
      bVar3 = bVar3 & 0x1f;
      uVar2 = side_segment_count >> bVar3;
      if (quads != (uint *)0x0 || quad_capacity != 0) {
        if ((quad_stride < 4) || (quad_capacity < uVar2 * uVar2)) goto LAB_00613361;
        if (side_segment_count >> bVar3 != 0) {
          uVar6 = 0;
          do {
            if (0 < (long)(uVar2 * quad_stride)) {
              puVar1 = quads + uVar2 * quad_stride;
              uVar8 = uVar6 * iVar5;
              uVar4 = uVar8 + iVar5;
              do {
                *quads = uVar8;
                quads[3] = uVar4;
                uVar8 = uVar8 + iVar7;
                uVar4 = uVar4 + iVar7;
                quads[1] = uVar8;
                quads[2] = uVar4;
                quads = quads + quad_stride;
              } while (quads < puVar1);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar2);
        }
      }
      if (sides == (uint *)0x0 && side_capacity == 0) {
LAB_006134c9:
        return uVar2 * uVar2;
      }
      if ((side_stride != 0) && (uVar2 * 4 + 1 <= side_capacity)) {
        if (side_segment_count >> bVar3 == 0) {
          uVar6 = 0;
        }
        else {
          puVar1 = sides + uVar2;
          uVar6 = 0;
          do {
            *sides = uVar6;
            uVar6 = uVar6 + iVar7;
            sides = sides + side_stride;
          } while (sides < puVar1);
        }
        if (side_segment_count >> bVar3 != 0) {
          puVar1 = sides + uVar2;
          do {
            *sides = uVar6;
            uVar6 = uVar6 + iVar5;
            sides = sides + side_stride;
          } while (sides < puVar1);
        }
        if (side_segment_count >> bVar3 != 0) {
          puVar1 = sides + uVar2;
          do {
            *sides = uVar6;
            uVar6 = uVar6 - iVar7;
            sides = sides + side_stride;
          } while (sides < puVar1);
        }
        if (side_segment_count >> bVar3 != 0) {
          puVar1 = sides + uVar2;
          do {
            *sides = uVar6;
            uVar6 = uVar6 - iVar5;
            sides = sides + side_stride;
          } while (sides < puVar1);
        }
        *sides = 0;
        goto LAB_006134c9;
      }
      goto LAB_00613361;
    }
  }
  ON_SubDIncrementErrorCount();
LAB_00613361:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::SetQuads(
  unsigned int side_segment_count,
  unsigned int level_of_detail,
  unsigned int* quads,
  size_t quad_capacity,
  size_t quad_stride,
  unsigned int* sides,
  size_t side_capacity,
  size_t side_stride
)
{
  if ( false == ON_SubDMeshFragment::SideSegmentCountIsValid(side_segment_count) )
    return ON_SUBD_RETURN_ERROR(0);

  if ( side_segment_count <= 1 )
    level_of_detail = 0;
  else if (level_of_detail > 0)
  {
    if (level_of_detail >= 32 || 1U << level_of_detail > side_segment_count)
    {
      level_of_detail = 1;
      while ( 2*level_of_detail < side_segment_count )
        level_of_detail*= 2;
    }
  }


  const unsigned int side_point_count = (side_segment_count+1);
  const unsigned int P_di = (1 << level_of_detail);
  const unsigned int P_dj = P_di*side_point_count;

  const unsigned int side_quad_count = side_segment_count / P_di;

  if (quad_capacity > 0 || nullptr != quads)
  {
    if ( quad_stride < 4 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_quad_count*side_quad_count > quad_capacity)
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int* fvi = quads;
    for (unsigned int n = 0; n < side_quad_count; n++)
    {
      unsigned int vi0 = n*P_dj;
      unsigned int vi1 = vi0 + P_dj;
      for (const unsigned int* fvi1 = fvi + quad_stride*side_quad_count; fvi < fvi1; fvi += quad_stride)
      {
        fvi[0] = vi0;
        fvi[3] = vi1;
        vi0 += P_di;
        vi1 += P_di;
        fvi[1] = vi0;
        fvi[2] = vi1;
      }
    }
  }

  if (side_capacity > 0 || nullptr != sides)
  {
    if ( side_stride < 1 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_capacity < 4*side_quad_count +1 )
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int vi = 0;

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_dj;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_dj;
    }

    *sides = 0;
  }

  return side_quad_count*side_quad_count;
}